

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int tls1_prf(uchar *secret,size_t slen,char *label,uchar *random,size_t rlen,uchar *dstbuf,
            size_t dlen)

{
  size_t sVar1;
  ulong keylen;
  size_t ilen;
  ulong local_150;
  ulong local_148;
  undefined1 local_138 [4];
  int ret;
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  uchar h_i [20];
  uchar local_f8 [4];
  uchar auStack_f4 [4];
  uchar tmp [128];
  uchar *S2;
  uchar *S1;
  size_t k;
  size_t j;
  size_t i;
  size_t hs;
  size_t nb;
  uchar *dstbuf_local;
  size_t rlen_local;
  uchar *random_local;
  char *label_local;
  size_t slen_local;
  uchar *secret_local;
  
  mbedtls_md_init((mbedtls_md_context_t *)local_138);
  sVar1 = strlen(label);
  if (sVar1 + 0x14 + rlen < 0x81) {
    keylen = slen + 1 >> 1;
    tmp._120_8_ = secret + (slen - keylen);
    sVar1 = strlen(label);
    memcpy(tmp + 0xc,label,sVar1);
    memcpy(tmp + sVar1 + 0xc,random,rlen);
    ilen = rlen + sVar1;
    md_ctx.hmac_ctx = mbedtls_md_info_from_type(MBEDTLS_MD_MD5);
    if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
      secret_local._4_4_ = -0x6c00;
    }
    else {
      secret_local._4_4_ =
           mbedtls_md_setup((mbedtls_md_context_t *)local_138,(mbedtls_md_info_t *)md_ctx.hmac_ctx,1
                           );
      if (secret_local._4_4_ == 0) {
        mbedtls_md_hmac_starts((mbedtls_md_context_t *)local_138,secret,keylen);
        mbedtls_md_hmac_update((mbedtls_md_context_t *)local_138,tmp + 0xc,ilen);
        mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_138,auStack_f4);
        for (j = 0; j < dlen; j = j + 0x10) {
          mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_138);
          mbedtls_md_hmac_update((mbedtls_md_context_t *)local_138,auStack_f4,ilen + 0x10);
          mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_138,(uchar *)&md_info);
          mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_138);
          mbedtls_md_hmac_update((mbedtls_md_context_t *)local_138,auStack_f4,0x10);
          mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_138,auStack_f4);
          if (dlen < j + 0x10) {
            local_148 = dlen & 0xf;
          }
          else {
            local_148 = 0x10;
          }
          for (k = 0; k < local_148; k = k + 1) {
            dstbuf[j + k] = h_i[k - 8];
          }
        }
        mbedtls_md_free((mbedtls_md_context_t *)local_138);
        md_ctx.hmac_ctx = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
        if ((mbedtls_md_info_t *)md_ctx.hmac_ctx == (mbedtls_md_info_t *)0x0) {
          secret_local._4_4_ = -0x6c00;
        }
        else {
          secret_local._4_4_ =
               mbedtls_md_setup((mbedtls_md_context_t *)local_138,
                                (mbedtls_md_info_t *)md_ctx.hmac_ctx,1);
          if (secret_local._4_4_ == 0) {
            mbedtls_md_hmac_starts((mbedtls_md_context_t *)local_138,(uchar *)tmp._120_8_,keylen);
            mbedtls_md_hmac_update((mbedtls_md_context_t *)local_138,tmp + 0xc,ilen);
            mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_138,local_f8);
            for (j = 0; j < dlen; j = j + 0x14) {
              mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_138);
              mbedtls_md_hmac_update((mbedtls_md_context_t *)local_138,local_f8,ilen + 0x14);
              mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_138,(uchar *)&md_info);
              mbedtls_md_hmac_reset((mbedtls_md_context_t *)local_138);
              mbedtls_md_hmac_update((mbedtls_md_context_t *)local_138,local_f8,0x14);
              mbedtls_md_hmac_finish((mbedtls_md_context_t *)local_138,local_f8);
              if (dlen < j + 0x14) {
                local_150 = dlen % 0x14;
              }
              else {
                local_150 = 0x14;
              }
              for (k = 0; k < local_150; k = k + 1) {
                dstbuf[j + k] = dstbuf[j + k] ^ h_i[k - 8];
              }
            }
            mbedtls_md_free((mbedtls_md_context_t *)local_138);
            mbedtls_zeroize(local_f8,0x80);
            mbedtls_zeroize(&md_info,0x14);
            secret_local._4_4_ = 0;
          }
        }
      }
    }
  }
  else {
    secret_local._4_4_ = -0x7100;
  }
  return secret_local._4_4_;
}

Assistant:

static int tls1_prf( const unsigned char *secret, size_t slen,
                     const char *label,
                     const unsigned char *random, size_t rlen,
                     unsigned char *dstbuf, size_t dlen )
{
    size_t nb, hs;
    size_t i, j, k;
    const unsigned char *S1, *S2;
    unsigned char tmp[128];
    unsigned char h_i[20];
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    int ret;

    mbedtls_md_init( &md_ctx );

    if( sizeof( tmp ) < 20 + strlen( label ) + rlen )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    hs = ( slen + 1 ) / 2;
    S1 = secret;
    S2 = secret + slen - hs;

    nb = strlen( label );
    memcpy( tmp + 20, label, nb );
    memcpy( tmp + 20 + nb, random, rlen );
    nb += rlen;

    /*
     * First compute P_md5(secret,label+random)[0..dlen]
     */
    if( ( md_info = mbedtls_md_info_from_type( MBEDTLS_MD_MD5 ) ) == NULL )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &md_ctx, S1, hs );
    mbedtls_md_hmac_update( &md_ctx, tmp + 20, nb );
    mbedtls_md_hmac_finish( &md_ctx, 4 + tmp );

    for( i = 0; i < dlen; i += 16 )
    {
        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, 4 + tmp, 16 + nb );
        mbedtls_md_hmac_finish( &md_ctx, h_i );

        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, 4 + tmp, 16 );
        mbedtls_md_hmac_finish( &md_ctx, 4 + tmp );

        k = ( i + 16 > dlen ) ? dlen % 16 : 16;

        for( j = 0; j < k; j++ )
            dstbuf[i + j]  = h_i[j];
    }

    mbedtls_md_free( &md_ctx );

    /*
     * XOR out with P_sha1(secret,label+random)[0..dlen]
     */
    if( ( md_info = mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 ) ) == NULL )
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );

    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 1 ) ) != 0 )
        return( ret );

    mbedtls_md_hmac_starts( &md_ctx, S2, hs );
    mbedtls_md_hmac_update( &md_ctx, tmp + 20, nb );
    mbedtls_md_hmac_finish( &md_ctx, tmp );

    for( i = 0; i < dlen; i += 20 )
    {
        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, 20 + nb );
        mbedtls_md_hmac_finish( &md_ctx, h_i );

        mbedtls_md_hmac_reset ( &md_ctx );
        mbedtls_md_hmac_update( &md_ctx, tmp, 20 );
        mbedtls_md_hmac_finish( &md_ctx, tmp );

        k = ( i + 20 > dlen ) ? dlen % 20 : 20;

        for( j = 0; j < k; j++ )
            dstbuf[i + j] = (unsigned char)( dstbuf[i + j] ^ h_i[j] );
    }

    mbedtls_md_free( &md_ctx );

    mbedtls_zeroize( tmp, sizeof( tmp ) );
    mbedtls_zeroize( h_i, sizeof( h_i ) );

    return( 0 );
}